

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_list_expression(gravity_parser_t *parser)

{
  size_t sVar1;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_t gVar2;
  gnode_t *pgVar3;
  gnode_r *list1_00;
  gnode_t **ppgVar4;
  bool ismap_00;
  gnode_t *local_d0;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  gnode_r *local_90;
  gnode_t *local_88;
  gnode_t *local_80;
  gnode_t *expr2_1;
  gnode_t *expr2;
  gnode_r *list2;
  gnode_r *list1;
  _Bool ismap;
  gnode_t *expr1;
  gtoken_s token;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  token.value = (char *)parser->lexer->p[parser->lexer->n - 1];
  parse_required(parser,TOK_OP_OPEN_SQUAREBRACKET);
  gravity_lexer_token((gtoken_s *)&expr1,(gravity_lexer_t *)token.value);
  gVar2 = gravity_lexer_peek((gravity_lexer_t *)token.value);
  if (gVar2 == TOK_OP_CLOSED_SQUAREBRACKET) {
    gravity_lexer_next((gravity_lexer_t *)token.value);
    if (parser->declarations->n == 0) {
      local_80 = (gnode_t *)0x0;
    }
    else {
      local_80 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_00.colno = token.type;
    token_00.position = token.lineno;
    token_00._0_8_ = expr1;
    token_00.bytes = token.colno;
    token_00.length = token.position;
    token_00.fileid = token.bytes;
    token_00.builtin = token.length;
    token_00.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)
                   gnode_list_expr_create(token_00,(gnode_r *)0x0,(gnode_r *)0x0,false,local_80);
  }
  else {
    gVar2 = gravity_lexer_peek((gravity_lexer_t *)token.value);
    if (gVar2 == TOK_OP_COLON) {
      gravity_lexer_next((gravity_lexer_t *)token.value);
      parse_required(parser,TOK_OP_CLOSED_SQUAREBRACKET);
      if (parser->declarations->n == 0) {
        local_88 = (gnode_t *)0x0;
      }
      else {
        local_88 = parser->declarations->p[parser->declarations->n - 1];
      }
      token_01.colno = token.type;
      token_01.position = token.lineno;
      token_01._0_8_ = expr1;
      token_01.bytes = token.colno;
      token_01.length = token.position;
      token_01.fileid = token.bytes;
      token_01.builtin = token.length;
      token_01.value = (char *)token._24_8_;
      parser_local = (gravity_parser_t *)
                     gnode_list_expr_create(token_01,(gnode_r *)0x0,(gnode_r *)0x0,true,local_88);
    }
    else {
      pgVar3 = parse_expression(parser);
      gVar2 = gravity_lexer_peek((gravity_lexer_t *)token.value);
      ismap_00 = gVar2 == TOK_OP_COLON;
      list1_00 = gnode_array_create();
      if (ismap_00) {
        local_90 = gnode_array_create();
      }
      else {
        local_90 = (gnode_r *)0x0;
      }
      if (pgVar3 != (gnode_t *)0x0) {
        if (list1_00->n == list1_00->m) {
          if (list1_00->m == 0) {
            local_98 = 8;
          }
          else {
            local_98 = list1_00->m << 1;
          }
          list1_00->m = local_98;
          ppgVar4 = (gnode_t **)realloc(list1_00->p,list1_00->m << 3);
          list1_00->p = ppgVar4;
        }
        sVar1 = list1_00->n;
        list1_00->n = sVar1 + 1;
        list1_00->p[sVar1] = pgVar3;
      }
      if (ismap_00) {
        parse_required(parser,TOK_OP_COLON);
        pgVar3 = parse_expression(parser);
        if (pgVar3 != (gnode_t *)0x0) {
          if (local_90->n == local_90->m) {
            if (local_90->m == 0) {
              local_a0 = 8;
            }
            else {
              local_a0 = local_90->m << 1;
            }
            local_90->m = local_a0;
            ppgVar4 = (gnode_t **)realloc(local_90->p,local_90->m << 3);
            local_90->p = ppgVar4;
          }
          sVar1 = local_90->n;
          local_90->n = sVar1 + 1;
          local_90->p[sVar1] = pgVar3;
        }
      }
      while (gVar2 = gravity_lexer_peek((gravity_lexer_t *)token.value), gVar2 == TOK_OP_COMMA) {
        gravity_lexer_next((gravity_lexer_t *)token.value);
        pgVar3 = parse_expression(parser);
        if (pgVar3 != (gnode_t *)0x0) {
          if (list1_00->n == list1_00->m) {
            if (list1_00->m == 0) {
              local_a8 = 8;
            }
            else {
              local_a8 = list1_00->m << 1;
            }
            list1_00->m = local_a8;
            ppgVar4 = (gnode_t **)realloc(list1_00->p,list1_00->m << 3);
            list1_00->p = ppgVar4;
          }
          sVar1 = list1_00->n;
          list1_00->n = sVar1 + 1;
          list1_00->p[sVar1] = pgVar3;
        }
        if (ismap_00) {
          parse_required(parser,TOK_OP_COLON);
          pgVar3 = parse_expression(parser);
          if (pgVar3 != (gnode_t *)0x0) {
            if (local_90->n == local_90->m) {
              if (local_90->m == 0) {
                local_b0 = 8;
              }
              else {
                local_b0 = local_90->m << 1;
              }
              local_90->m = local_b0;
              ppgVar4 = (gnode_t **)realloc(local_90->p,local_90->m << 3);
              local_90->p = ppgVar4;
            }
            sVar1 = local_90->n;
            local_90->n = sVar1 + 1;
            local_90->p[sVar1] = pgVar3;
          }
        }
      }
      parse_required(parser,TOK_OP_CLOSED_SQUAREBRACKET);
      if (parser->declarations->n == 0) {
        local_d0 = (gnode_t *)0x0;
      }
      else {
        local_d0 = parser->declarations->p[parser->declarations->n - 1];
      }
      token_02.colno = token.type;
      token_02.position = token.lineno;
      token_02._0_8_ = expr1;
      token_02.bytes = token.colno;
      token_02.length = token.position;
      token_02.fileid = token.bytes;
      token_02.builtin = token.length;
      token_02.value = (char *)token._24_8_;
      parser_local = (gravity_parser_t *)
                     gnode_list_expr_create(token_02,list1_00,local_90,ismap_00,local_d0);
    }
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_list_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_list_expression");
    DECLARE_LEXER;

    /*
     list_expression
     :    '[' ((expression) (',' expression)*)? ']'        // array or empty array
     |    '[' ((map_entry (',' map_entry)*) | ':') ']'    // map or empty map
     ;

     map_entry
     :    STRING ':' expression
     ;
     */

    // consume first '['
    parse_required(parser, TOK_OP_OPEN_SQUAREBRACKET);

    // this saved token is necessary to save start of the list/map
    gtoken_s token = gravity_lexer_token(lexer);

    // check for special empty list
    if (gravity_lexer_peek(lexer) == TOK_OP_CLOSED_SQUAREBRACKET) {
        gravity_lexer_next(lexer); // consume TOK_OP_CLOSED_SQUAREBRACKET
        return gnode_list_expr_create(token, NULL, NULL, false, LAST_DECLARATION());
    }

    // check for special empty map
    if (gravity_lexer_peek(lexer) == TOK_OP_COLON) {
        gravity_lexer_next(lexer); // consume TOK_OP_COLON
        parse_required(parser, TOK_OP_CLOSED_SQUAREBRACKET);
        return gnode_list_expr_create(token, NULL, NULL, true, LAST_DECLARATION());
    }

    // parse first expression (if any) outside of the list/map loop
    // in order to check if it is a list or map expression
    gnode_t *expr1 = parse_expression(parser);

    // if next token is a colon then assume a map
    bool ismap = (gravity_lexer_peek(lexer) == TOK_OP_COLON);

    // a list expression can be an array [expr1, expr2] or a map [string1: expr1, string2: expr2]
    // cannot be mixed so be very restrictive here

    gnode_r *list1 = gnode_array_create();
    gnode_r *list2 = (ismap) ? gnode_array_create() : NULL;
    if (expr1) gnode_array_push(list1, expr1);

    if (ismap) {
        parse_required(parser, TOK_OP_COLON);
        gnode_t *expr2 = parse_expression(parser);
        if (expr2) gnode_array_push(list2, expr2);
    }

    while (gravity_lexer_peek(lexer) == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA

        // parse first expression
        expr1 = parse_expression(parser);
        if (expr1) gnode_array_push(list1, expr1);

        if (ismap) {
            parse_required(parser, TOK_OP_COLON);
            gnode_t *expr2 = parse_expression(parser);
            if (expr2) gnode_array_push(list2, expr2);
        }
    }

    parse_required(parser, TOK_OP_CLOSED_SQUAREBRACKET);
    return gnode_list_expr_create(token, list1, list2, ismap, LAST_DECLARATION());
}